

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagepattern.cpp
# Opt level: O2

UBool __thiscall
icu_63::MessagePatternList<icu_63::MessagePattern::Part,_32>::ensureCapacityForOneMore
          (MessagePatternList<icu_63::MessagePattern::Part,_32> *this,int32_t oldLength,
          UErrorCode *errorCode)

{
  Part *pPVar1;
  
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    if (oldLength < (this->a).capacity) {
      return '\x01';
    }
    pPVar1 = MaybeStackArray<icu_63::MessagePattern::Part,_32>::resize
                       (&this->a,oldLength * 2,oldLength);
    if (pPVar1 != (Part *)0x0) {
      return '\x01';
    }
    *errorCode = U_MEMORY_ALLOCATION_ERROR;
  }
  return '\0';
}

Assistant:

UBool
MessagePatternList<T, stackCapacity>::ensureCapacityForOneMore(int32_t oldLength, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) {
        return FALSE;
    }
    if(a.getCapacity()>oldLength || a.resize(2*oldLength, oldLength)!=NULL) {
        return TRUE;
    }
    errorCode=U_MEMORY_ALLOCATION_ERROR;
    return FALSE;
}